

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O1

bool __thiscall
HullLibrary::CleanupVertices
          (HullLibrary *this,uint svcount,cbtVector3 *svertices,uint stride,uint *vcount,
          cbtVector3 *vertices,cbtScalar normalepsilon,cbtVector3 *scale)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  byte bVar8;
  ushort uVar9;
  int iVar10;
  ulong uVar11;
  void *pvVar12;
  cbtScalar *pcVar13;
  ulong uVar14;
  cbtVector3 *pcVar15;
  long lVar16;
  cbtVector3 *pcVar17;
  int iVar18;
  long lVar19;
  uint *puVar20;
  cbtScalar *pcVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar35 [64];
  cbtScalar dist1;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  cbtScalar bmax_1 [3];
  cbtScalar bmin_1 [3];
  cbtScalar bmax [3];
  cbtScalar bmin [3];
  float local_a8 [4];
  float local_98 [4];
  float local_88 [4];
  float local_78 [4];
  cbtVector3 *local_68;
  uint *local_60;
  undefined1 local_58 [16];
  cbtScalar *local_40;
  ulong local_38;
  undefined1 auVar40 [64];
  
  auVar35._4_60_ = in_register_00001204;
  auVar35._0_4_ = normalepsilon;
  if (svcount != 0) {
    iVar10 = *(int *)(this + 0x24);
    lVar19 = (long)iVar10;
    local_58 = auVar35._0_16_;
    local_68 = vertices;
    local_60 = vcount;
    if ((lVar19 < 1) && (iVar10 < 0)) {
      if (*(int *)(this + 0x28) < 0) {
        if (*(void **)(this + 0x30) != (void *)0x0) {
          if (this[0x38] == (HullLibrary)0x1) {
            cbtAlignedFreeInternal(*(void **)(this + 0x30));
            auVar35 = ZEXT1664(local_58);
          }
          *(undefined8 *)(this + 0x30) = 0;
        }
        this[0x38] = (HullLibrary)0x1;
        *(undefined8 *)(this + 0x30) = 0;
        *(undefined4 *)(this + 0x28) = 0;
      }
      if (iVar10 < 0) {
        memset((void *)(*(long *)(this + 0x30) + lVar19 * 4),0,lVar19 * -4);
        auVar35 = ZEXT1664(local_58);
      }
    }
    iVar10 = 0;
    *(undefined4 *)(this + 0x24) = 0;
    *local_60 = 0;
    scale->m_floats[0] = 1.0;
    scale->m_floats[1] = 1.0;
    scale->m_floats[2] = 1.0;
    local_78[0] = 3.4028235e+38;
    local_78[1] = 3.4028235e+38;
    local_78[2] = 3.4028235e+38;
    local_88[0] = -3.4028235e+38;
    local_88[1] = -3.4028235e+38;
    local_88[2] = -3.4028235e+38;
    uVar14 = (ulong)stride;
    pcVar15 = svertices;
    do {
      lVar19 = 0;
      do {
        fVar25 = pcVar15->m_floats[lVar19];
        if (fVar25 < local_78[lVar19]) {
          local_78[lVar19] = fVar25;
        }
        if (local_88[lVar19] < fVar25) {
          local_88[lVar19] = fVar25;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != 3);
      pcVar15 = (cbtVector3 *)((long)pcVar15->m_floats + uVar14);
      iVar10 = iVar10 + 1;
    } while (iVar10 != svcount + (svcount == 0));
    fVar29 = local_88[0] - local_78[0];
    fVar27 = local_88[1] - local_78[1];
    fVar39 = local_88[2] - local_78[2];
    auVar32 = SUB6416(ZEXT464(0x3f000000),0);
    auVar30 = vfmadd231ss_fma(ZEXT416((uint)local_78[0]),ZEXT416((uint)fVar29),auVar32);
    auVar31 = vfmadd231ss_fma(ZEXT416((uint)local_78[1]),ZEXT416((uint)fVar27),auVar32);
    auVar32 = vfmadd231ss_fma(ZEXT416((uint)local_78[2]),ZEXT416((uint)fVar39),auVar32);
    fVar25 = auVar30._0_4_;
    fVar28 = auVar31._0_4_;
    if ((((svcount < 3) || (fVar29 < 1e-06)) || (fVar27 < 1e-06)) || (fVar39 < 1e-06)) {
      auVar31 = SUB6416(ZEXT464(0x358637bd),0);
      uVar5 = vcmpss_avx512f(auVar31,ZEXT416((uint)fVar29),1);
      bVar7 = (bool)((byte)uVar5 & 1);
      auVar30 = vminss_avx(ZEXT416((uint)fVar29),SUB6416(ZEXT464(0x7f7fffff),0));
      uVar22 = (uint)bVar7 * auVar30._0_4_ + (uint)!bVar7 * 0x7f7fffff;
      auVar30 = vminss_avx(ZEXT416((uint)fVar27),ZEXT416(uVar22));
      uVar5 = vcmpss_avx512f(auVar31,ZEXT416((uint)fVar27),1);
      bVar7 = (bool)((byte)uVar5 & 1);
      uVar22 = (uint)bVar7 * auVar30._0_4_ + !bVar7 * uVar22;
      uVar5 = vcmpps_avx512vl(ZEXT416((uint)fVar39),ZEXT416(uVar22),1);
      uVar6 = vcmpps_avx512vl(auVar31,ZEXT416((uint)fVar39),1);
      bVar8 = (byte)uVar6 & (byte)uVar5;
      fVar26 = (float)((uint)(bVar8 & 1) * (int)fVar39 + !(bool)(bVar8 & 1) * uVar22);
      if ((fVar26 != 3.4028235e+38) || (NAN(fVar26))) {
        fVar26 = fVar26 * 0.05;
        uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar29),auVar31,1);
        bVar7 = (bool)((byte)uVar5 & 1);
        fVar29 = (float)((uint)bVar7 * (int)fVar26 + (uint)!bVar7 * (int)fVar29);
        uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar27),auVar31,1);
        bVar7 = (bool)((byte)uVar5 & 1);
        fVar27 = (float)((uint)bVar7 * (int)fVar26 + (uint)!bVar7 * (int)fVar27);
        if (1e-06 <= fVar39) {
          fVar26 = fVar39;
        }
      }
      else {
        fVar27 = 0.01;
        fVar29 = 0.01;
        fVar26 = 0.01;
      }
      fVar39 = fVar25 - fVar29;
      fVar25 = fVar25 + fVar29;
      fVar29 = fVar28 - fVar27;
      fVar28 = fVar28 + fVar27;
      fVar27 = auVar32._0_4_ - fVar26;
      fVar26 = auVar32._0_4_ + fVar26;
      local_68->m_floats[0] = fVar39;
      local_68->m_floats[1] = fVar29;
      local_68->m_floats[2] = fVar27;
      *local_60 = 1;
      local_68[1].m_floats[0] = fVar25;
      local_68[1].m_floats[1] = fVar29;
      local_68[1].m_floats[2] = fVar27;
      *local_60 = 2;
      local_68[2].m_floats[0] = fVar25;
      local_68[2].m_floats[1] = fVar28;
      local_68[2].m_floats[2] = fVar27;
      *local_60 = 3;
      local_68[3].m_floats[0] = fVar39;
      local_68[3].m_floats[1] = fVar28;
      local_68[3].m_floats[2] = fVar27;
      *local_60 = 4;
      local_68[4].m_floats[0] = fVar39;
      local_68[4].m_floats[1] = fVar29;
      local_68[4].m_floats[2] = fVar26;
      *local_60 = 5;
      local_68[5].m_floats[0] = fVar25;
      local_68[5].m_floats[1] = fVar29;
      local_68[5].m_floats[2] = fVar26;
      *local_60 = 6;
      local_68[6].m_floats[0] = fVar25;
      local_68[6].m_floats[1] = fVar28;
      local_68[6].m_floats[2] = fVar26;
      *local_60 = 7;
      local_68[7].m_floats[0] = fVar39;
      local_68[7].m_floats[1] = fVar28;
      local_68[7].m_floats[2] = fVar26;
    }
    else {
      scale->m_floats[0] = fVar29;
      scale->m_floats[1] = fVar27;
      scale->m_floats[2] = fVar39;
      fVar39 = 1.0 / fVar39;
      auVar40 = ZEXT1664(ZEXT416((uint)fVar39));
      fVar25 = (1.0 / fVar29) * fVar25;
      fVar28 = fVar28 * (1.0 / fVar27);
      auVar30 = vmulss_avx512f(auVar32,ZEXT416((uint)fVar39));
      auVar41 = ZEXT1664(auVar30);
      pcVar21 = local_68->m_floats + 2;
      uVar22 = 0;
      auVar31 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar42 = ZEXT1664(auVar31);
      puVar20 = local_60;
      pcVar15 = local_68;
      local_40 = pcVar21;
      local_38 = uVar14;
      do {
        fVar26 = (1.0 / fVar29) * svertices->m_floats[0];
        fVar2 = (1.0 / fVar27) * svertices->m_floats[1];
        fVar3 = auVar40._0_4_ * svertices->m_floats[2];
        uVar1 = *puVar20;
        uVar11 = (ulong)uVar1;
        uVar24 = 0;
        if (uVar11 != 0) {
          fVar4 = fVar2 - fVar28;
          auVar32 = vsubss_avx512f(ZEXT416((uint)fVar3),auVar41._0_16_);
          auVar31 = ZEXT416((uint)(fVar26 - fVar25));
          auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar4)),auVar31,auVar31);
          auVar31 = vfmadd231ss_fma(auVar31,auVar32,auVar32);
          uVar23 = 0;
          pcVar13 = pcVar21;
          do {
            auVar34 = auVar42._0_16_;
            auVar32 = vandps_avx512vl(ZEXT416((uint)(((cbtVector3 *)(pcVar13 + -2))->m_floats[0] -
                                                    fVar26)),auVar34);
            auVar33 = vandps_avx512vl(ZEXT416((uint)(pcVar13[-1] - fVar2)),auVar34);
            auVar34 = vandps_avx512vl(ZEXT416((uint)(*pcVar13 - fVar3)),auVar34);
            uVar5 = vcmpps_avx512vl(auVar33,auVar35._0_16_,5);
            uVar6 = vcmpps_avx512vl(auVar32,auVar35._0_16_,5);
            uVar9 = (ushort)uVar6 | (ushort)uVar5;
            bVar7 = auVar34._0_4_ < auVar35._0_4_;
            if (bVar7 && (uVar9 & 1) == 0) {
              fVar4 = pcVar13[-1] - fVar28;
              auVar33 = vsubss_avx512f(ZEXT416((uint)*pcVar13),auVar41._0_16_);
              auVar32 = ZEXT416((uint)(((cbtVector3 *)(pcVar13 + -2))->m_floats[0] - fVar25));
              auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar4)),auVar32,auVar32);
              auVar32 = vfmadd231ss_fma(auVar32,auVar33,auVar33);
              if (auVar32._0_4_ < auVar31._0_4_) {
                ((cbtVector3 *)(pcVar13 + -2))->m_floats[0] = fVar26;
                pcVar13[-1] = fVar2;
                *pcVar13 = fVar3;
              }
              uVar24 = uVar23;
              if (bVar7 && (uVar9 & 1) == 0) break;
            }
            uVar23 = uVar23 + 1;
            pcVar13 = pcVar13 + 4;
            uVar24 = uVar11;
          } while (uVar11 != uVar23);
        }
        if ((uint)uVar24 == uVar1) {
          pcVar15[uVar11].m_floats[0] = fVar26;
          pcVar15[uVar11].m_floats[1] = fVar2;
          pcVar15[uVar11].m_floats[2] = fVar3;
          *puVar20 = uVar1 + 1;
        }
        iVar10 = *(int *)(this + 0x24);
        if (iVar10 == *(int *)(this + 0x28)) {
          iVar18 = iVar10 * 2;
          if (iVar10 == 0) {
            iVar18 = 1;
          }
          if (*(int *)(this + 0x28) < iVar18) {
            if (iVar18 == 0) {
              pvVar12 = (void *)0x0;
            }
            else {
              pvVar12 = cbtAlignedAllocInternal((long)iVar18 << 2,0x10);
            }
            iVar10 = *(int *)(this + 0x24);
            if (0 < (long)iVar10) {
              lVar19 = *(long *)(this + 0x30);
              lVar16 = 0;
              do {
                *(undefined4 *)((long)pvVar12 + lVar16 * 4) = *(undefined4 *)(lVar19 + lVar16 * 4);
                lVar16 = lVar16 + 1;
              } while (iVar10 != lVar16);
            }
            auVar35 = ZEXT1664(local_58);
            auVar31 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar42 = ZEXT1664(auVar31);
            if (*(void **)(this + 0x30) != (void *)0x0) {
              if (this[0x38] == (HullLibrary)0x1) {
                cbtAlignedFreeInternal(*(void **)(this + 0x30));
                auVar31 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar42 = ZEXT1664(auVar31);
                auVar35 = ZEXT1664(local_58);
              }
              *(undefined8 *)(this + 0x30) = 0;
            }
            auVar41 = ZEXT464(auVar30._0_4_);
            auVar40 = ZEXT464((uint)fVar39);
            this[0x38] = (HullLibrary)0x1;
            *(void **)(this + 0x30) = pvVar12;
            *(int *)(this + 0x28) = iVar18;
            puVar20 = local_60;
            pcVar15 = local_68;
            uVar14 = local_38;
            pcVar21 = local_40;
          }
        }
        svertices = (cbtVector3 *)((long)svertices->m_floats + uVar14);
        *(uint *)(*(long *)(this + 0x30) + (long)*(int *)(this + 0x24) * 4) = (uint)uVar24;
        *(int *)(this + 0x24) = *(int *)(this + 0x24) + 1;
        uVar22 = uVar22 + 1;
      } while (uVar22 != svcount);
      local_98[0] = 3.4028235e+38;
      local_98[1] = 3.4028235e+38;
      local_98[2] = 3.4028235e+38;
      local_a8[0] = -3.4028235e+38;
      local_a8[1] = -3.4028235e+38;
      local_a8[2] = -3.4028235e+38;
      uVar22 = *puVar20;
      if ((ulong)uVar22 != 0) {
        uVar14 = 0;
        pcVar17 = pcVar15;
        do {
          lVar19 = 0;
          do {
            fVar25 = pcVar17->m_floats[lVar19];
            if (fVar25 < local_98[lVar19]) {
              local_98[lVar19] = fVar25;
            }
            if (local_a8[lVar19] < fVar25) {
              local_a8[lVar19] = fVar25;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 != 3);
          uVar14 = uVar14 + 1;
          pcVar17 = pcVar17 + 1;
        } while (uVar14 != uVar22);
      }
      local_a8[0] = local_a8[0] - local_98[0];
      local_a8[1] = local_a8[1] - local_98[1];
      local_a8[2] = local_a8[2] - local_98[2];
      if (((2 < uVar22) && (1e-06 <= local_a8[0])) &&
         ((1e-06 <= local_a8[1] && (1e-06 <= local_a8[2])))) goto LAB_009165d5;
      auVar34 = ZEXT416((uint)local_a8[0]);
      auVar30 = SUB6416(ZEXT464(0x3f000000),0);
      auVar31 = vfmadd231ss_fma(ZEXT416((uint)local_98[0]),auVar34,auVar30);
      auVar36 = ZEXT416((uint)local_a8[1]);
      auVar32 = vfmadd231ss_fma(ZEXT416((uint)local_98[1]),auVar36,auVar30);
      auVar37 = ZEXT416((uint)local_a8[2]);
      auVar33 = vfmadd231ss_fma(ZEXT416((uint)local_98[2]),auVar37,auVar30);
      auVar38 = SUB6416(ZEXT464(0x358637bd),0);
      uVar5 = vcmpss_avx512f(auVar38,auVar34,2);
      bVar7 = (bool)((byte)uVar5 & 1);
      auVar30 = vminss_avx(auVar34,SUB6416(ZEXT464(0x7f7fffff),0));
      uVar22 = (uint)bVar7 * auVar30._0_4_ + (uint)!bVar7 * 0x7f7fffff;
      auVar30 = vminss_avx(auVar36,ZEXT416(uVar22));
      uVar5 = vcmpss_avx512f(auVar38,auVar36,2);
      bVar7 = (bool)((byte)uVar5 & 1);
      uVar22 = (uint)bVar7 * auVar30._0_4_ + !bVar7 * uVar22;
      uVar5 = vcmpps_avx512vl(auVar37,ZEXT416(uVar22),1);
      uVar6 = vcmpps_avx512vl(auVar38,auVar37,2);
      bVar8 = (byte)uVar6 & (byte)uVar5;
      fVar25 = (float)((uint)(bVar8 & 1) * (int)local_a8[2] + !(bool)(bVar8 & 1) * uVar22);
      if ((fVar25 != 3.4028235e+38) || (NAN(fVar25))) {
        fVar25 = fVar25 * 0.05;
        uVar5 = vcmpss_avx512f(auVar34,auVar38,1);
        bVar7 = (bool)((byte)uVar5 & 1);
        fVar28 = (float)((uint)bVar7 * (int)fVar25 + (uint)!bVar7 * (int)local_a8[0]);
        uVar5 = vcmpss_avx512f(auVar36,auVar38,1);
        bVar7 = (bool)((byte)uVar5 & 1);
        fVar29 = (float)((uint)bVar7 * (int)fVar25 + (uint)!bVar7 * (int)local_a8[1]);
        if (1e-06 <= local_a8[2]) {
          fVar25 = local_a8[2];
        }
      }
      else {
        fVar29 = 0.01;
        fVar28 = 0.01;
        fVar25 = 0.01;
      }
      fVar27 = auVar31._0_4_ - fVar28;
      fVar28 = auVar31._0_4_ + fVar28;
      fVar39 = auVar32._0_4_ - fVar29;
      fVar29 = auVar32._0_4_ + fVar29;
      fVar26 = auVar33._0_4_ - fVar25;
      fVar25 = auVar33._0_4_ + fVar25;
      *puVar20 = 0;
      pcVar15->m_floats[0] = fVar27;
      pcVar15->m_floats[1] = fVar39;
      pcVar15->m_floats[2] = fVar26;
      *puVar20 = 1;
      pcVar15[1].m_floats[0] = fVar28;
      pcVar15[1].m_floats[1] = fVar39;
      pcVar15[1].m_floats[2] = fVar26;
      *puVar20 = 2;
      pcVar15[2].m_floats[0] = fVar28;
      pcVar15[2].m_floats[1] = fVar29;
      pcVar15[2].m_floats[2] = fVar26;
      *puVar20 = 3;
      pcVar15[3].m_floats[0] = fVar27;
      pcVar15[3].m_floats[1] = fVar29;
      pcVar15[3].m_floats[2] = fVar26;
      *puVar20 = 4;
      pcVar15[4].m_floats[0] = fVar27;
      pcVar15[4].m_floats[1] = fVar39;
      pcVar15[4].m_floats[2] = fVar25;
      *puVar20 = 5;
      pcVar15[5].m_floats[0] = fVar28;
      pcVar15[5].m_floats[1] = fVar39;
      pcVar15[5].m_floats[2] = fVar25;
      *puVar20 = 6;
      pcVar15[6].m_floats[0] = fVar28;
      pcVar15[6].m_floats[1] = fVar29;
      pcVar15[6].m_floats[2] = fVar25;
      *puVar20 = 7;
      pcVar15[7].m_floats[0] = fVar27;
      pcVar15[7].m_floats[1] = fVar29;
      pcVar15[7].m_floats[2] = fVar25;
      local_60 = puVar20;
    }
    *local_60 = 8;
  }
LAB_009165d5:
  return svcount != 0;
}

Assistant:

bool HullLibrary::CleanupVertices(unsigned int svcount,
								  const cbtVector3 *svertices,
								  unsigned int stride,
								  unsigned int &vcount,  // output number of vertices
								  cbtVector3 *vertices,   // location to store the results.
								  cbtScalar normalepsilon,
								  cbtVector3 &scale)
{
	if (svcount == 0) return false;

	m_vertexIndexMapping.resize(0);

#define EPSILON cbtScalar(0.000001) /* close enough to consider two cbtScalaring point numbers to be 'the same'. */

	vcount = 0;

	cbtScalar recip[3] = {0.f, 0.f, 0.f};

	if (scale)
	{
		scale[0] = 1;
		scale[1] = 1;
		scale[2] = 1;
	}

	cbtScalar bmin[3] = {FLT_MAX, FLT_MAX, FLT_MAX};
	cbtScalar bmax[3] = {-FLT_MAX, -FLT_MAX, -FLT_MAX};

	const char *vtx = (const char *)svertices;

	//	if ( 1 )
	{
		for (unsigned int i = 0; i < svcount; i++)
		{
			const cbtScalar *p = (const cbtScalar *)vtx;

			vtx += stride;

			for (int j = 0; j < 3; j++)
			{
				if (p[j] < bmin[j]) bmin[j] = p[j];
				if (p[j] > bmax[j]) bmax[j] = p[j];
			}
		}
	}

	cbtScalar dx = bmax[0] - bmin[0];
	cbtScalar dy = bmax[1] - bmin[1];
	cbtScalar dz = bmax[2] - bmin[2];

	cbtVector3 center;

	center[0] = dx * cbtScalar(0.5) + bmin[0];
	center[1] = dy * cbtScalar(0.5) + bmin[1];
	center[2] = dz * cbtScalar(0.5) + bmin[2];

	if (dx < EPSILON || dy < EPSILON || dz < EPSILON || svcount < 3)
	{
		cbtScalar len = FLT_MAX;

		if (dx > EPSILON && dx < len) len = dx;
		if (dy > EPSILON && dy < len) len = dy;
		if (dz > EPSILON && dz < len) len = dz;

		if (len == FLT_MAX)
		{
			dx = dy = dz = cbtScalar(0.01);  // one centimeter
		}
		else
		{
			if (dx < EPSILON) dx = len * cbtScalar(0.05);  // 1/5th the shortest non-zero edge.
			if (dy < EPSILON) dy = len * cbtScalar(0.05);
			if (dz < EPSILON) dz = len * cbtScalar(0.05);
		}

		cbtScalar x1 = center[0] - dx;
		cbtScalar x2 = center[0] + dx;

		cbtScalar y1 = center[1] - dy;
		cbtScalar y2 = center[1] + dy;

		cbtScalar z1 = center[2] - dz;
		cbtScalar z2 = center[2] + dz;

		addPoint(vcount, vertices, x1, y1, z1);
		addPoint(vcount, vertices, x2, y1, z1);
		addPoint(vcount, vertices, x2, y2, z1);
		addPoint(vcount, vertices, x1, y2, z1);
		addPoint(vcount, vertices, x1, y1, z2);
		addPoint(vcount, vertices, x2, y1, z2);
		addPoint(vcount, vertices, x2, y2, z2);
		addPoint(vcount, vertices, x1, y2, z2);

		return true;  // return cube
	}
	else
	{
		if (scale)
		{
			scale[0] = dx;
			scale[1] = dy;
			scale[2] = dz;

			recip[0] = 1 / dx;
			recip[1] = 1 / dy;
			recip[2] = 1 / dz;

			center[0] *= recip[0];
			center[1] *= recip[1];
			center[2] *= recip[2];
		}
	}

	vtx = (const char *)svertices;

	for (unsigned int i = 0; i < svcount; i++)
	{
		const cbtVector3 *p = (const cbtVector3 *)vtx;
		vtx += stride;

		cbtScalar px = p->getX();
		cbtScalar py = p->getY();
		cbtScalar pz = p->getZ();

		if (scale)
		{
			px = px * recip[0];  // normalize
			py = py * recip[1];  // normalize
			pz = pz * recip[2];  // normalize
		}

		//		if ( 1 )
		{
			unsigned int j;

			for (j = 0; j < vcount; j++)
			{
				/// XXX might be broken
				cbtVector3 &v = vertices[j];

				cbtScalar x = v[0];
				cbtScalar y = v[1];
				cbtScalar z = v[2];

				cbtScalar dx = cbtFabs(x - px);
				cbtScalar dy = cbtFabs(y - py);
				cbtScalar dz = cbtFabs(z - pz);

				if (dx < normalepsilon && dy < normalepsilon && dz < normalepsilon)
				{
					// ok, it is close enough to the old one
					// now let us see if it is further from the center of the point cloud than the one we already recorded.
					// in which case we keep this one instead.

					cbtScalar dist1 = GetDist(px, py, pz, center);
					cbtScalar dist2 = GetDist(v[0], v[1], v[2], center);

					if (dist1 > dist2)
					{
						v[0] = px;
						v[1] = py;
						v[2] = pz;
					}

					break;
				}
			}

			if (j == vcount)
			{
				cbtVector3 &dest = vertices[vcount];
				dest[0] = px;
				dest[1] = py;
				dest[2] = pz;
				vcount++;
			}
			m_vertexIndexMapping.push_back(j);
		}
	}

	// ok..now make sure we didn't prune so many vertices it is now invalid.
	//	if ( 1 )
	{
		cbtScalar bmin[3] = {FLT_MAX, FLT_MAX, FLT_MAX};
		cbtScalar bmax[3] = {-FLT_MAX, -FLT_MAX, -FLT_MAX};

		for (unsigned int i = 0; i < vcount; i++)
		{
			const cbtVector3 &p = vertices[i];
			for (int j = 0; j < 3; j++)
			{
				if (p[j] < bmin[j]) bmin[j] = p[j];
				if (p[j] > bmax[j]) bmax[j] = p[j];
			}
		}

		cbtScalar dx = bmax[0] - bmin[0];
		cbtScalar dy = bmax[1] - bmin[1];
		cbtScalar dz = bmax[2] - bmin[2];

		if (dx < EPSILON || dy < EPSILON || dz < EPSILON || vcount < 3)
		{
			cbtScalar cx = dx * cbtScalar(0.5) + bmin[0];
			cbtScalar cy = dy * cbtScalar(0.5) + bmin[1];
			cbtScalar cz = dz * cbtScalar(0.5) + bmin[2];

			cbtScalar len = FLT_MAX;

			if (dx >= EPSILON && dx < len) len = dx;
			if (dy >= EPSILON && dy < len) len = dy;
			if (dz >= EPSILON && dz < len) len = dz;

			if (len == FLT_MAX)
			{
				dx = dy = dz = cbtScalar(0.01);  // one centimeter
			}
			else
			{
				if (dx < EPSILON) dx = len * cbtScalar(0.05);  // 1/5th the shortest non-zero edge.
				if (dy < EPSILON) dy = len * cbtScalar(0.05);
				if (dz < EPSILON) dz = len * cbtScalar(0.05);
			}

			cbtScalar x1 = cx - dx;
			cbtScalar x2 = cx + dx;

			cbtScalar y1 = cy - dy;
			cbtScalar y2 = cy + dy;

			cbtScalar z1 = cz - dz;
			cbtScalar z2 = cz + dz;

			vcount = 0;  // add box

			addPoint(vcount, vertices, x1, y1, z1);
			addPoint(vcount, vertices, x2, y1, z1);
			addPoint(vcount, vertices, x2, y2, z1);
			addPoint(vcount, vertices, x1, y2, z1);
			addPoint(vcount, vertices, x1, y1, z2);
			addPoint(vcount, vertices, x2, y1, z2);
			addPoint(vcount, vertices, x2, y2, z2);
			addPoint(vcount, vertices, x1, y2, z2);

			return true;
		}
	}

	return true;
}